

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * fio_realloc2(void *ptr,size_t new_size,size_t copy_length)

{
  ulong uVar1;
  size_t local_48;
  void *new_mem;
  size_t copy_length_local;
  size_t new_size_local;
  void *ptr_local;
  
  if ((ptr == (void *)0x0) || ((longdouble *)ptr == &on_malloc_zero)) {
    ptr_local = fio_malloc(new_size);
  }
  else if (new_size == 0) {
    fio_free(ptr);
    ptr_local = fio_malloc(0);
  }
  else if (((ulong)ptr & 0x7fff) == 0x10) {
    ptr_local = big_realloc(ptr,new_size);
  }
  else {
    ptr_local = fio_malloc(new_size);
    if (ptr_local == (void *)0x0) {
      ptr_local = (void *)0x0;
    }
    else {
      uVar1 = (new_size >> 4) + (long)(int)(uint)((new_size & 0xf) != 0);
      local_48 = (copy_length >> 4) + (long)(int)(uint)((copy_length & 0xf) != 0);
      if (uVar1 < local_48) {
        local_48 = uVar1;
      }
      fio_memcpy(ptr_local,ptr,local_48);
      block_slice_free(ptr);
    }
  }
  return ptr_local;
}

Assistant:

void *fio_realloc2(void *ptr, size_t new_size, size_t copy_length) {
  if (!ptr || ptr == (void *)&on_malloc_zero) {
    return fio_malloc(new_size);
  }
  if (!new_size) {
    goto zero_size;
  }
  if (((uintptr_t)ptr & FIO_MEMORY_BLOCK_MASK) == 16) {
    /* big reallocation - direct from the system */
    return big_realloc(ptr, new_size);
  }
  /* allocated within block - don't even try to expand the allocation */
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  void *new_mem = fio_malloc(new_size);
  if (!new_mem)
    return NULL;
  new_size = ((new_size >> 4) + (!!(new_size & 15)));
  copy_length = ((copy_length >> 4) + (!!(copy_length & 15)));
  fio_memcpy(new_mem, ptr, copy_length > new_size ? new_size : copy_length);

  block_slice_free(ptr);
  return new_mem;
zero_size:
  fio_free(ptr);
  return fio_malloc(0);
}